

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

VkDescriptorSet
Diligent::AllocateDescriptorSet
          (VulkanLogicalDevice *LogicalDevice,VkDescriptorPool Pool,VkDescriptorSetLayout SetLayout,
          char *DebugName)

{
  VkDescriptorSet pVVar1;
  VkDescriptorSetLayout local_30;
  VkDescriptorSetAllocateInfo local_28;
  
  local_28.pSetLayouts = &local_30;
  local_28.pNext = (void *)0x0;
  local_28.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_28._4_4_ = 0;
  local_28.descriptorSetCount = 1;
  local_28._28_4_ = 0;
  local_30 = SetLayout;
  local_28.descriptorPool = Pool;
  pVVar1 = VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
                     (LogicalDevice,&local_28,DebugName);
  return pVVar1;
}

Assistant:

static VkDescriptorSet AllocateDescriptorSet(const VulkanUtilities::VulkanLogicalDevice& LogicalDevice,
                                             VkDescriptorPool                            Pool,
                                             VkDescriptorSetLayout                       SetLayout,
                                             const char*                                 DebugName)
{
    VkDescriptorSetAllocateInfo DescrSetAllocInfo = {};

    DescrSetAllocInfo.sType              = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    DescrSetAllocInfo.pNext              = nullptr;
    DescrSetAllocInfo.descriptorPool     = Pool;
    DescrSetAllocInfo.descriptorSetCount = 1;
    DescrSetAllocInfo.pSetLayouts        = &SetLayout;
    // Descriptor pools are externally synchronized, meaning that the application must not allocate
    // and/or free descriptor sets from the same pool in multiple threads simultaneously (13.2.3)
    return LogicalDevice.AllocateVkDescriptorSet(DescrSetAllocInfo, DebugName);
}